

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O2

int __thiscall AC3StreamReader::readPacketTHD(AC3StreamReader *this,AVPacket *avPacket)

{
  int iVar1;
  int iVar2;
  CodecInfo *pCVar3;
  ostream *poVar4;
  pointer puVar5;
  long lVar6;
  long lVar7;
  AVPacket *pAVar8;
  AVPacket *pAVar9;
  byte bVar10;
  string local_50;
  
  bVar10 = 0;
  if ((this->m_thdDemuxWaitAc3 == true) && ((this->m_delayedAc3Buffer).m_size != 0)) {
    pAVar8 = &this->m_delayedAc3Packet;
    pAVar9 = avPacket;
    for (lVar7 = 0x4c; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(char *)&pAVar9->pts = (char)pAVar8->pts;
      pAVar8 = (AVPacket *)((long)&pAVar8->pts + 1);
      pAVar9 = (AVPacket *)((long)&pAVar9->pts + 1);
    }
    (this->m_delayedAc3Buffer).m_size = 0;
LAB_0018d5d2:
    this->m_thdDemuxWaitAc3 = false;
    lVar7 = this->m_nextAc3Time;
    avPacket->pts = lVar7;
    avPacket->dts = lVar7;
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x40;
    this->m_nextAc3Time = lVar7 + (this->super_AC3Codec).m_frameDuration;
    iVar2 = 0;
  }
  else {
    while (iVar2 = SimplePacketizerReader::readPacket(&this->super_SimplePacketizerReader,avPacket),
          iVar2 == 0) {
      if ((this->super_AC3Codec).m_state != stateDecodeTrueHDFirst) {
        lVar7 = this->m_totalTHDSamples;
        lVar6 = (lVar7 * 0x13b6d8300) / (long)(this->super_AC3Codec).mlp.m_samplerate;
        avPacket->pts = lVar6;
        avPacket->dts = lVar6;
        iVar2 = (this->super_AC3Codec).mlp.m_samples;
        this->m_totalTHDSamples = lVar7 + iVar2;
        iVar2 = this->m_demuxedTHDSamples + iVar2;
        this->m_demuxedTHDSamples = iVar2;
        iVar1 = (this->super_AC3Codec).m_samples;
        if (iVar2 < iVar1) {
          return 0;
        }
        this->m_demuxedTHDSamples = iVar2 - iVar1;
        this->m_thdDemuxWaitAc3 = true;
        return 0;
      }
      if (this->m_thdDemuxWaitAc3 == true) goto LAB_0018d5d2;
      if ((this->m_delayedAc3Buffer).m_size != 0) {
        pCVar3 = AC3Codec::getCodecInfo(&this->super_AC3Codec);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&pCVar3->displayName);
        poVar4 = std::operator<<(poVar4," stream (track ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_streamIndex);
        poVar4 = std::operator<<(poVar4,"): overlapped frame detected at position ");
        floatToTime_abi_cxx11_(&local_50,(double)avPacket->pts / 5292000000.0,',');
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4,". Remove frame.");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_50);
        sLastMsg = true;
      }
      pAVar8 = avPacket;
      pAVar9 = &this->m_delayedAc3Packet;
      for (lVar7 = 0x4c; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(char *)&pAVar9->pts = (char)pAVar8->pts;
        pAVar8 = (AVPacket *)((long)pAVar8 + (ulong)bVar10 * -2 + 1);
        pAVar9 = (AVPacket *)((long)pAVar9 + (ulong)bVar10 * -2 + 1);
      }
      (this->m_delayedAc3Buffer).m_size = 0;
      MemoryBlock::append(&this->m_delayedAc3Buffer,avPacket->data,(long)avPacket->size);
      puVar5 = (this->m_delayedAc3Buffer).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar5 == (this->m_delayedAc3Buffer).m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        puVar5 = (pointer)0x0;
      }
      (this->m_delayedAc3Packet).data = puVar5;
    }
  }
  return iVar2;
}

Assistant:

int AC3StreamReader::readPacketTHD(AVPacket& avPacket)
{
    if (m_thdDemuxWaitAc3 && !m_delayedAc3Buffer.isEmpty())
    {
        avPacket = m_delayedAc3Packet;
        m_delayedAc3Buffer.clear();
        m_thdDemuxWaitAc3 = false;
        avPacket.dts = avPacket.pts = m_nextAc3Time;
        avPacket.flags |= AVPacket::IS_CORE_PACKET;
        m_nextAc3Time += m_frameDuration;
        return 0;
    }

    while (true)
    {
        const int rez = SimplePacketizerReader::readPacket(avPacket);
        if (rez != 0)
            return rez;

        const bool isAc3Packet = (m_state == AC3State::stateDecodeTrueHDFirst);

        if (isAc3Packet)
        {
            if (m_thdDemuxWaitAc3)
            {
                m_thdDemuxWaitAc3 = false;
                avPacket.dts = avPacket.pts = m_nextAc3Time;
                avPacket.flags |= AVPacket::IS_CORE_PACKET;
                m_nextAc3Time += m_frameDuration;
                return 0;
            }
            if (!m_delayedAc3Buffer.isEmpty())
            {
                LTRACE(LT_INFO, 2,
                       getCodecInfo().displayName
                           << " stream (track " << m_streamIndex << "): overlapped frame detected at position "
                           << floatToTime((double)(avPacket.pts - PTS_CONST_OFFSET) / INTERNAL_PTS_FREQ, ',')
                           << ". Remove frame.");
            }

            m_delayedAc3Packet = avPacket;
            m_delayedAc3Buffer.clear();
            m_delayedAc3Buffer.append(avPacket.data, avPacket.size);
            m_delayedAc3Packet.data = m_delayedAc3Buffer.data();
        }
        else
        {
            // thg packet
            avPacket.dts = avPacket.pts = m_totalTHDSamples * INTERNAL_PTS_FREQ / mlp.m_samplerate;

            m_totalTHDSamples += mlp.m_samples;
            m_demuxedTHDSamples += mlp.m_samples;
            if (m_demuxedTHDSamples >= m_samples)
            {
                m_demuxedTHDSamples -= m_samples;
                m_thdDemuxWaitAc3 = true;
            }
            return 0;
        }
    }
}